

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O1

void __thiscall duckdb::Executor::Executor(Executor *this,ClientContext *context)

{
  this->context = context;
  (this->task).internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->task).internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  switchD_01306cb1::default(&this->physical_plan,0,0x88);
  (this->producer).
  super_unique_ptr<duckdb::ProducerToken,_std::default_delete<duckdb::ProducerToken>_>._M_t.
  super___uniq_ptr_impl<duckdb::ProducerToken,_std::default_delete<duckdb::ProducerToken>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ProducerToken_*,_std::default_delete<duckdb::ProducerToken>_>.
  super__Head_base<0UL,_duckdb::ProducerToken_*,_false>._M_head_impl = (ProducerToken *)0x0;
  (this->events).
  super_vector<duckdb::shared_ptr<duckdb::Event,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Event,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::Event,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Event,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->events).
  super_vector<duckdb::shared_ptr<duckdb::Event,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Event,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::Event,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Event,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->events).
  super_vector<duckdb::shared_ptr<duckdb::Event,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Event,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::Event,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Event,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->profiler).internal.super___shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->profiler).internal.super___shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->error_manager).error_lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->error_manager).error_lock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->error_manager).error_lock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->error_manager).error_lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->error_manager).error_lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->error_manager).exceptions.
  super_vector<duckdb::ErrorData,_std::allocator<duckdb::ErrorData>_>.
  super__Vector_base<duckdb::ErrorData,_std::allocator<duckdb::ErrorData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->error_manager).exceptions.
  super_vector<duckdb::ErrorData,_std::allocator<duckdb::ErrorData>_>.
  super__Vector_base<duckdb::ErrorData,_std::allocator<duckdb::ErrorData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->error_manager).exceptions.
  super_vector<duckdb::ErrorData,_std::allocator<duckdb::ErrorData>_>.
  super__Vector_base<duckdb::ErrorData,_std::allocator<duckdb::ErrorData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->error_manager).has_error._M_base._M_i = false;
  (this->to_be_rescheduled_tasks)._M_h._M_buckets =
       &(this->to_be_rescheduled_tasks)._M_h._M_single_bucket;
  (this->to_be_rescheduled_tasks)._M_h._M_bucket_count = 1;
  (this->to_be_rescheduled_tasks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->to_be_rescheduled_tasks)._M_h._M_element_count = 0;
  (this->to_be_rescheduled_tasks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->to_be_rescheduled_tasks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->to_be_rescheduled_tasks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ::std::condition_variable::condition_variable(&this->task_reschedule);
  (this->executor_tasks).super___atomic_base<unsigned_long>._M_i = 0;
  (this->blocked_thread_time).super___atomic_base<unsigned_long>._M_i = 0;
  return;
}

Assistant:

Executor::Executor(ClientContext &context) : context(context), executor_tasks(0), blocked_thread_time(0) {
}